

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  Value *other_local;
  Value *this_local;
  
  swapPayload(this,other);
  std::swap<Json::Value::CommentInfo*>(&this->comments_,&other->comments_);
  std::swap<long>(&this->start_,&other->start_);
  std::swap<long>(&this->limit_,&other->limit_);
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}